

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O1

MPP_RET reset_nalu_buf(Avs2dCtx_t *p_dec)

{
  MPP_RET MVar1;
  MPP_RET extraout_EAX;
  void *pvVar3;
  Avs2dStreamBuf_t *pAVar2;
  
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","reset_nalu_buf");
  }
  p_dec->prev_start_code = 0;
  p_dec->new_frame_flag = 0;
  p_dec->prev_tail_data[0] = 0xff;
  p_dec->prev_tail_data[1] = 0xff;
  p_dec->prev_tail_data[2] = 0xff;
  p_dec->prev_tail_data[3] = 0xff;
  p_dec->prev_tail_data[3] = 0xff;
  p_dec->prev_tail_data[4] = 0xff;
  p_dec->prev_tail_data[5] = 0xff;
  p_dec->prev_tail_data[6] = 0xff;
  pAVar2 = p_dec->p_stream;
  if (pAVar2 != (Avs2dStreamBuf_t *)0x0) {
    memset(pAVar2->pbuf,0,(ulong)pAVar2->size);
    p_dec->p_stream->len = 0;
  }
  pAVar2 = p_dec->p_header;
  if (pAVar2 != (Avs2dStreamBuf_t *)0x0) {
    memset(pAVar2->pbuf,0,(ulong)pAVar2->size);
    pAVar2 = p_dec->p_header;
    pAVar2->len = 0;
  }
  MVar1 = (MPP_RET)pAVar2;
  if (p_dec->p_nals != (Avs2dNalu_t *)0x0) {
    pvVar3 = memset(p_dec->p_nals,0,(ulong)p_dec->nal_allocated << 4);
    MVar1 = (MPP_RET)pvVar3;
    p_dec->nal_cnt = 0;
  }
  if (((byte)avs2d_parse_debug & 8) == 0) {
    return MVar1;
  }
  _mpp_log_l(4,"avs2d_parse","Out.","reset_nalu_buf");
  return extraout_EAX;
}

Assistant:

static MPP_RET reset_nalu_buf(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;

    AVS2D_PARSE_TRACE("In.");
    p_dec->prev_start_code = 0;
    p_dec->new_frame_flag = 0;

    memset(p_dec->prev_tail_data, 0xff, AVS2D_PACKET_SPLIT_CHECKER_BUFFER_SIZE);

    if (p_dec->p_stream) {
        memset(p_dec->p_stream->pbuf, 0, p_dec->p_stream->size);
        p_dec->p_stream->len = 0;
    }

    if (p_dec->p_header) {
        memset(p_dec->p_header->pbuf, 0, p_dec->p_header->size);
        p_dec->p_header->len = 0;
    }

    if (p_dec->p_nals) {
        memset(p_dec->p_nals, 0, sizeof(Avs2dNalu_t) * p_dec->nal_allocated);
        p_dec->nal_cnt = 0;
    }

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}